

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O0

void __thiscall
onmt::SubwordLearner::learn(SubwordLearner *this,string *model_path,char *description,bool verbose)

{
  byte bVar1;
  invalid_argument *this_00;
  byte in_CL;
  undefined8 in_RDX;
  string *in_RSI;
  long *in_RDI;
  ofstream out;
  string local_250 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  
  std::ofstream::ofstream(&stack0xfffffffffffffde0,in_RSI,_S_out);
  bVar1 = std::ios::operator!((ios *)(&stack0xfffffffffffffde0 +
                                     in_stack_fffffffffffffde0[-1]._M_string_length));
  if ((bVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x30))(in_RDI,&stack0xfffffffffffffde0,in_RDX,in_CL & 1);
    std::ofstream::~ofstream(&stack0xfffffffffffffde0);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::invalid_argument::invalid_argument(this_00,local_250);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void SubwordLearner::learn(const std::string& model_path, const char* description, bool verbose)
  {
    std::ofstream out(model_path);
    if (!out)
      throw std::invalid_argument("Failed to open model path " + model_path);
    learn(out, description, verbose);
  }